

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O0

vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *
vk::enumerateInstanceExtensionProperties
          (vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
           *__return_storage_ptr__,PlatformInterface *vkp,char *layerName)

{
  char *pcVar1;
  char *pcVar2;
  VkResult VVar3;
  deBool dVar4;
  reference pvVar5;
  ulong uVar6;
  size_type sVar7;
  TestError *this;
  uint local_28;
  undefined1 local_21;
  deUint32 numExtensions;
  char *layerName_local;
  PlatformInterface *vkp_local;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *properties;
  
  local_21 = 0;
  _numExtensions = layerName;
  layerName_local = (char *)vkp;
  vkp_local = (PlatformInterface *)__return_storage_ptr__;
  std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::vector
            (__return_storage_ptr__);
  local_28 = 0;
  VVar3 = (**(code **)(*(long *)layerName_local + 0x10))(layerName_local,_numExtensions,&local_28,0)
  ;
  checkResult(VVar3,"vkp.enumerateInstanceExtensionProperties(layerName, &numExtensions, DE_NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
              ,0xc2);
  if (local_28 != 0) {
    std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::resize
              (__return_storage_ptr__,(ulong)local_28);
    pcVar2 = layerName_local;
    pcVar1 = _numExtensions;
    pvVar5 = std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
             operator[](__return_storage_ptr__,0);
    VVar3 = (**(code **)(*(long *)pcVar2 + 0x10))(pcVar2,pcVar1,&local_28,pvVar5);
    checkResult(VVar3,
                "vkp.enumerateInstanceExtensionProperties(layerName, &numExtensions, &properties[0])"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                ,199);
    do {
      dVar4 = ::deGetFalse();
      if ((dVar4 != 0) ||
         (uVar6 = (ulong)local_28,
         sVar7 = std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                 ::size(__return_storage_ptr__), uVar6 != sVar7)) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,(char *)0x0,"(size_t)numExtensions == properties.size()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                   ,200);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<VkExtensionProperties> enumerateInstanceExtensionProperties (const PlatformInterface& vkp, const char* layerName)
{
	vector<VkExtensionProperties>	properties;
	deUint32						numExtensions	= 0;

	VK_CHECK(vkp.enumerateInstanceExtensionProperties(layerName, &numExtensions, DE_NULL));

	if (numExtensions > 0)
	{
		properties.resize(numExtensions);
		VK_CHECK(vkp.enumerateInstanceExtensionProperties(layerName, &numExtensions, &properties[0]));
		TCU_CHECK((size_t)numExtensions == properties.size());
	}

	return properties;
}